

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O2

uint32 __thiscall Js::FunctionBody::GetNonTempLocalVarCount(FunctionBody *this)

{
  code *pcVar1;
  bool bVar2;
  uint32 uVar3;
  RegSlot RVar4;
  undefined4 *puVar5;
  
  uVar3 = GetEndNonTempLocalIndex(this);
  RVar4 = GetConstantCount(this);
  if (uVar3 < RVar4) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x464,
                                "(this->GetEndNonTempLocalIndex() >= this->GetFirstNonTempLocalIndex())"
                                ,
                                "this->GetEndNonTempLocalIndex() >= this->GetFirstNonTempLocalIndex()"
                               );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar5 = 0;
  }
  uVar3 = GetEndNonTempLocalIndex(this);
  RVar4 = GetConstantCount(this);
  return uVar3 - RVar4;
}

Assistant:

uint32
    FunctionBody::GetNonTempLocalVarCount()
    {
        Assert(this->GetEndNonTempLocalIndex() >= this->GetFirstNonTempLocalIndex());
        return this->GetEndNonTempLocalIndex() - this->GetFirstNonTempLocalIndex();
    }